

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AviWriter.cpp
# Opt level: O3

void __thiscall
AviWriter::AviWriter
          (AviWriter *this,char *outputFileName,uint bufferSize,unsigned_short movieWidth,
          unsigned_short movieHeight,uint movieFPS)

{
  FILE *pFVar1;
  size_t sVar2;
  
  this->fBufferSize = bufferSize;
  this->fMovieWidth = movieWidth;
  this->fMovieHeight = movieHeight;
  this->fMovieFPS = movieFPS;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->indexRecords).c.super__Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_>::_M_initialize_map
            ((_Deque_base<AVIIndexRecord_*,_std::allocator<AVIIndexRecord_*>_> *)&this->indexRecords
             ,0);
  pFVar1 = fopen(outputFileName,"wb");
  this->fOutFid = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file ",0x14);
    if (outputFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1191d0);
    }
    else {
      sVar2 = strlen(outputFileName);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,outputFileName,sVar2)
      ;
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
  }
  this->fNumSubsessions = 2;
  this->fNumBytesWritten = 0;
  this->fPrevAudioPts = 0;
  this->fAVISamplingFrequency = 0;
  this->fWAVCodecTag = 0;
  this->fVideoSTRHFrameCountPosition = 0;
  this->fAudioSTRHFrameCountPosition = 0;
  this->fNumAudioChannels = 0;
  this->fRIFFSizePosition = 0;
  this->fRIFFSizeValue = 0;
  this->fJunkNumber = 0;
  this->fMoviSizePosition = 0;
  this->fMoviSizeValue = 0;
  this->fAVIHMaxBytesPerSecondPosition = 0;
  this->fAVIHFrameCountPosition = 0;
  this->fVideoMaxBytesPerSecond = 0;
  this->fNumVideoFrames = 0;
  this->fPrevVideoPts = 0;
  this->fAVIScale = 0;
  this->fAVIRate = 0;
  this->fAVISize = 0;
  this->fAVISubsessionTag = 0;
  this->fAVICodecHandlerType = 0;
  this->fAudioMaxBytesPerSecond = 0;
  this->fNumAudioFrames = 0;
  addFileHeader_AVI(this);
  return;
}

Assistant:

AviWriter::AviWriter(const char *outputFileName, unsigned int bufferSize, unsigned short movieWidth,
                     unsigned short movieHeight, unsigned int movieFPS) :
    fBufferSize(bufferSize), fMovieWidth(movieWidth), fMovieHeight(movieHeight), fMovieFPS(movieFPS)
{
    fOutFid = fopen(outputFileName, "wb");

    if (fOutFid == NULL)
        std::cerr << "Unable to open file " << outputFileName << std::endl;

    fNumSubsessions = 2;

    fNumBytesWritten = 0;

    fRIFFSizePosition = fRIFFSizeValue = 0;
    fJunkNumber = 0;
    fMoviSizePosition = fMoviSizeValue = 0;
    fAVIHMaxBytesPerSecondPosition = 0;
    fAVIHFrameCountPosition = 0;
    fVideoMaxBytesPerSecond = 0;
    fNumVideoFrames = 0;
    fPrevVideoPts = 0;
    fAVIScale = 0;
    fAVIRate = 0;
    fAVISize = 0;
    fAVISubsessionTag = 0;
    fAVICodecHandlerType = 0;
    fAudioMaxBytesPerSecond = 0;
    fNumAudioFrames = 0;
    fPrevAudioPts = 0;
    fAVISamplingFrequency = 0;
    fWAVCodecTag = 0;
    fVideoSTRHFrameCountPosition = 0;
    fAudioSTRHFrameCountPosition = 0;
    fNumAudioChannels = 0;

    addFileHeader_AVI();
}